

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

void __thiscall ODDLParser::Value::~Value(Value *this)

{
  Reference *this_00;
  Value *this_01;
  Reference *tmp;
  
  this_00 = (Reference *)this->m_data;
  if (this_00 != (Reference *)0x0) {
    if (this->m_type == ddl_ref) {
      Reference::~Reference(this_00);
      operator_delete(this_00,0x10);
    }
    else {
      operator_delete__(this_00);
    }
  }
  this_01 = this->m_next;
  if (this_01 != (Value *)0x0) {
    ~Value(this_01);
    operator_delete(this_01,0x20);
    return;
  }
  return;
}

Assistant:

Value::~Value() {
    if(m_data!=ddl_nullptr) {
        if (m_type == ddl_ref ) {
            Reference *tmp = (Reference *) m_data;
            if (tmp != ddl_nullptr)
                delete tmp;
        }else
            delete[] m_data;

    }
    if(m_next!=ddl_nullptr)
        delete m_next;
}